

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtil.cc
# Opt level: O0

void __thiscall tt::FileUtil::AppendFile::append(AppendFile *this,char *logline,size_t len)

{
  int iVar1;
  size_t sVar2;
  int err;
  size_t x;
  size_t remain;
  size_t n;
  size_t len_local;
  char *logline_local;
  AppendFile *this_local;
  
  remain = mywrite(this,logline,len);
  while( true ) {
    x = len - remain;
    if (x == 0) {
      return;
    }
    sVar2 = mywrite(this,logline + remain,x);
    if (sVar2 == 0) break;
    remain = sVar2 + remain;
  }
  iVar1 = ferror((FILE *)this->m_fp);
  if (iVar1 == 0) {
    return;
  }
  fprintf(_stderr,"AppendFile::append() failed !\n");
  return;
}

Assistant:

void FileUtil::AppendFile::append(const char* logline,const size_t len){
	size_t n = mywrite(logline,len);
	size_t remain = len - n;

	while( remain > 0){
		size_t x = mywrite(logline + n, remain);

		if(x == 0){
			int err = ferror(m_fp);
			if(err) fprintf(stderr,"AppendFile::append() failed !\n");
			break;
		}
		n += x;
		remain = len - n;
	}
}